

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O0

void __thiscall RVO::Agent::computeNeighbors(Agent *this)

{
  float local_14;
  Agent *pAStack_10;
  float rangeSq;
  Agent *this_local;
  
  pAStack_10 = this;
  std::
  vector<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
  ::clear(&this->obstacleNeighbors_);
  local_14 = sqr(this->timeHorizonObst_ * this->maxSpeed_ + this->radius_);
  KdTree::computeObstacleNeighbors(this->sim_->kdTree_,this,local_14);
  std::
  vector<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
  ::clear(&this->agentNeighbors_);
  if (this->maxNeighbors_ != 0) {
    local_14 = sqr(this->neighborDist_);
    KdTree::computeAgentNeighbors(this->sim_->kdTree_,this,&local_14);
  }
  return;
}

Assistant:

void Agent::computeNeighbors()
	{
		obstacleNeighbors_.clear();
		float rangeSq = sqr(timeHorizonObst_ * maxSpeed_ + radius_);
		sim_->kdTree_->computeObstacleNeighbors(this, rangeSq);

		agentNeighbors_.clear();

		if (maxNeighbors_ > 0) {
			rangeSq = sqr(neighborDist_);
			sim_->kdTree_->computeAgentNeighbors(this, rangeSq);
		}
	}